

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

MethodHandle * __thiscall
jsonrpccxx::methodHandle<unsigned_int,unsigned_int,unsigned_int>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          function<unsigned_int_(unsigned_int,_unsigned_int)> *method)

{
  function<unsigned_int_(unsigned_int,_unsigned_int)> local_38;
  jsonrpccxx *local_18;
  function<unsigned_int_(unsigned_int,_unsigned_int)> *method_local;
  
  local_18 = this;
  method_local = (function<unsigned_int_(unsigned_int,_unsigned_int)> *)__return_storage_ptr__;
  std::function<unsigned_int_(unsigned_int,_unsigned_int)>::function
            (&local_38,(function<unsigned_int_(unsigned_int,_unsigned_int)> *)this);
  createMethodHandle<unsigned_int,unsigned_int,unsigned_int,0ul,1ul>
            (__return_storage_ptr__,(jsonrpccxx *)&local_38);
  std::function<unsigned_int_(unsigned_int,_unsigned_int)>::~function(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle methodHandle(std::function<ReturnType(ParamTypes...)> method) {
    return createMethodHandle(method, std::index_sequence_for<ParamTypes...>{});
  }